

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O1

void print_shifts(action *p)

{
  bool bVar1;
  action **ppaVar2;
  int iVar3;
  action *paVar4;
  
  iVar3 = 0;
  bVar1 = false;
  paVar4 = p;
  if (p != (action *)0x0) {
    do {
      if (paVar4->suppressed < '\x02') {
        iVar3 = iVar3 + (uint)(paVar4->action_code == '\x01');
      }
      ppaVar2 = &paVar4->next;
      paVar4 = *ppaVar2;
    } while (*ppaVar2 != (action *)0x0);
    bVar1 = 0 < iVar3;
  }
  if ((p != (action *)0x0) && (bVar1)) {
    do {
      if ((p->action_code == '\x01') && (p->suppressed == '\0')) {
        fprintf((FILE *)verbose_file,"\t%s  shift %d\n",symbol_name[p->symbol],
                (ulong)(uint)p->number);
      }
      p = p->next;
    } while (p != (action *)0x0);
  }
  return;
}

Assistant:

void print_shifts(action *p)
{
    register int count;
    register action *q;

    count = 0;
    for (q = p; q; q = q->next)
    {
	if (q->suppressed < 2 && q->action_code == SHIFT)
	    ++count;
    }

    if (count > 0)
    {
	for (; p; p = p->next)
	{
	    if (p->action_code == SHIFT && p->suppressed == 0)
		fprintf(verbose_file, "\t%s  shift %d\n",
			    symbol_name[p->symbol], p->number);
	}
    }
}